

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fShaderMatrixTests.cpp
# Opt level: O2

void deqp::gles2::Functional::MatrixCaseUtils::Evaluator<2,_2,_5,_0,_2>::evaluate
               (ShaderEvalContext *evalCtx)

{
  tcu local_68 [8];
  Vector<float,_2> local_60;
  Vector<float,_3> local_58;
  undefined1 local_48 [16];
  VecAccess<float,_4,_3> local_38;
  
  getInputValue<2,5>((ShaderEvalContext *)local_48,(int)evalCtx);
  tcu::Vector<float,_2>::Vector(&local_60,(Vector<float,_2> *)(s_constInVec2 + 8));
  tcu::operator*(local_68,(Matrix<float,_2,_2> *)local_48,&local_60);
  local_58.m_data._0_8_ = local_68;
  local_58.m_data[2] = local_68._0_4_;
  local_38.m_vector = &evalCtx->color;
  local_38.m_index[0] = 0;
  local_38.m_index[1] = 1;
  local_38.m_index[2] = 2;
  tcu::VecAccess<float,_4,_3>::operator=(&local_38,&local_58);
  return;
}

Assistant:

static void evaluate (ShaderEvalContext& evalCtx)
	{
		evalCtx.color.xyz() = reduceToVec3(getInputValue<In0Type, In0DataType>(evalCtx, 0) * getInputValue<In1Type, In1DataType>(evalCtx, 1));
	}